

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O3

void __thiscall skiwi::reg_alloc::make_all_available(reg_alloc *this)

{
  byte bVar1;
  pointer poVar2;
  byte *pbVar3;
  byte local_2d;
  uint local_2c;
  
  local_2d = 0;
  poVar2 = (this->available_registers).
           super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((*(int *)&(this->available_registers).
                super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                ._M_impl.super__Vector_impl_data._M_finish - (int)poVar2 & 0x3fcU) != 0) {
    do {
      bVar1 = local_2d;
      pbVar3 = std::
               map<assembler::asmcode::operand,_unsigned_char,_std::less<assembler::asmcode::operand>,_std::allocator<std::pair<const_assembler::asmcode::operand,_unsigned_char>_>_>
               ::operator[](&this->register_to_index,poVar2 + local_2d);
      *pbVar3 = bVar1;
      std::
      _Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
      ::_M_insert_unique<unsigned_char_const&>
                ((_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                  *)&this->free_registers,&local_2d);
      local_2d = local_2d + 1;
      poVar2 = (this->available_registers).
               super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while ((uint)local_2d <
             ((uint)(*(int *)&(this->available_registers).
                              super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (int)poVar2) >> 2 & 0xff)
            );
  }
  local_2c = 0;
  if (this->nr_locals != 0) {
    do {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&this->free_locals,&local_2c);
      local_2c = local_2c + 1;
    } while (local_2c < this->nr_locals);
  }
  return;
}

Assistant:

void reg_alloc::make_all_available()
  {
  for (uint8_t i = 0; i < (uint8_t)available_registers.size(); ++i)
    {
    register_to_index[available_registers[i]] = i;
    free_registers.insert(i);
    }

  for (uint32_t i = 0; i < nr_locals; ++i)
    free_locals.insert(i);
  }